

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontInfo.cpp
# Opt level: O3

string * __thiscall
FontInfo::getCharSetName_abi_cxx11_(string *__return_storage_ptr__,FontInfo *this,uint8_t charSet)

{
  char *pcVar1;
  uint uVar2;
  uint __len;
  char *local_48 [2];
  char local_38 [16];
  
  uVar2 = (uint)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)uVar2 < 0xa1) {
    if ((int)uVar2 < 0x4d) {
      if (uVar2 == 0) {
        pcVar1 = "ANSI";
      }
      else if (uVar2 == 1) {
        pcVar1 = "DEFAULT";
      }
      else {
        if (uVar2 != 2) goto switchD_0013ec6c_caseD_83;
        pcVar1 = "SYMBOL";
      }
    }
    else {
      switch(uVar2) {
      case 0x80:
        pcVar1 = "SHIFTJIS";
        break;
      case 0x81:
        pcVar1 = "HANGUL";
        break;
      case 0x82:
        pcVar1 = "JOHAB";
        break;
      case 0x83:
      case 0x84:
      case 0x85:
      case 0x87:
switchD_0013ec6c_caseD_83:
        __len = 1;
        if (9 < (byte)this) {
          __len = 3 - ((byte)this < 100);
        }
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct((ulong)local_48,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_48[0],__len,uVar2 & 0xff);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
        if (local_48[0] == local_38) {
          return __return_storage_ptr__;
        }
        operator_delete(local_48[0]);
        return __return_storage_ptr__;
      case 0x86:
        pcVar1 = "GB2312";
        break;
      case 0x88:
        pcVar1 = "CHINESEBIG5";
        break;
      default:
        if (uVar2 != 0x4d) goto switchD_0013ec6c_caseD_83;
        pcVar1 = "MAC";
      }
    }
  }
  else if ((int)uVar2 < 0xba) {
    if ((int)uVar2 < 0xa3) {
      if (uVar2 == 0xa1) {
        pcVar1 = "GREEK";
      }
      else {
        if (uVar2 != 0xa2) goto switchD_0013ec6c_caseD_83;
        pcVar1 = "TURKISH";
      }
    }
    else if (uVar2 == 0xa3) {
      pcVar1 = "VIETNAMESE";
    }
    else if (uVar2 == 0xb1) {
      pcVar1 = "HEBREW";
    }
    else {
      if (uVar2 != 0xb2) goto switchD_0013ec6c_caseD_83;
      pcVar1 = "ARABIC";
    }
  }
  else if ((int)uVar2 < 0xde) {
    if (uVar2 == 0xba) {
      pcVar1 = "BALTIC";
    }
    else {
      if (uVar2 != 0xcc) goto switchD_0013ec6c_caseD_83;
      pcVar1 = "RUSSIAN";
    }
  }
  else if (uVar2 == 0xde) {
    pcVar1 = "THAI";
  }
  else if (uVar2 == 0xee) {
    pcVar1 = "EASTEUROPE";
  }
  else {
    if (uVar2 != 0xff) goto switchD_0013ec6c_caseD_83;
    pcVar1 = "OEM";
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string FontInfo::getCharSetName(std::uint8_t charSet)
{
    std::string str;

    switch(charSet)
    {
        case 0: // ANSI_CHARSET
            str = "ANSI";
            break;
        case 1: // DEFAULT_CHARSET
            str = "DEFAULT";
            break;
        case 2: // SYMBOL_CHARSET
            str = "SYMBOL";
            break;
        case 128: // SHIFTJIS_CHARSET
            str = "SHIFTJIS";
            break;
        case 129: // HANGUL_CHARSET
            str = "HANGUL";
            break;
        case 134: // GB2312_CHARSET
            str = "GB2312";
            break;
        case 136: // CHINESEBIG5_CHARSET
            str = "CHINESEBIG5";
            break;
        case 255: // OEM_CHARSET
            str = "OEM";
            break;
        case 130: // JOHAB_CHARSET
            str = "JOHAB";
            break;
        case 177: // HEBREW_CHARSET
            str = "HEBREW";
            break;
        case 178: // ARABIC_CHARSET
            str = "ARABIC";
            break;
        case 161: // GREEK_CHARSET
            str = "GREEK";
            break;
        case 162: // TURKISH_CHARSET
            str = "TURKISH";
            break;
        case 163: // VIETNAMESE_CHARSET
            str = "VIETNAMESE";
            break;
        case 222: // THAI_CHARSET
            str = "THAI";
            break;
        case 238: // EASTEUROPE_CHARSET
            str = "EASTEUROPE";
            break;
        case 204: // RUSSIAN_CHARSET
            str = "RUSSIAN";
            break;
        case 77:  // MAC_CHARSET
            str = "MAC";
            break;
        case 186: // BALTIC_CHARSET
            str = "BALTIC";
            break;

        default:
            str = std::to_string(charSet);
    }

    return str;
}